

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O3

uint32 __thiscall Clasp::UncoreMinimize::analyze(UncoreMinimize *this,Solver *s)

{
  uint *puVar1;
  int iVar2;
  pointer pLVar3;
  uint uVar4;
  ulong uVar5;
  pointer puVar6;
  uint uVar7;
  uint32 uVar8;
  long lVar9;
  pointer pLVar10;
  size_type sVar11;
  long lVar12;
  bool bVar13;
  LitPair p;
  uint local_58;
  LitPair local_50;
  long local_48;
  Todo *local_40;
  pointer local_38;
  
  if ((this->conflict_).ebo_.size == 0) {
    local_58 = (s->levels_).super_type.ebo_.size;
    uVar8 = 0;
    uVar4 = local_58;
  }
  else {
    pLVar3 = (this->conflict_).ebo_.buf;
    local_50.lit.rep_ = pLVar3->rep_;
    local_50.id = pLVar3[1].rep_;
    iVar2 = (this->litData_).ebo_.buf[local_50.id - 1].weight;
    bk_lib::
    pod_vector<Clasp::UncoreMinimize::LitPair,_std::allocator<Clasp::UncoreMinimize::LitPair>_>::
    push_back(&(this->todo_).lits_,&local_50);
    if (iVar2 < (this->todo_).minW_) {
      (this->todo_).minW_ = iVar2;
    }
    local_58 = *(uint *)((long)(s->assign_).assign_.ebo_.buf +
                        (ulong)(local_50.lit.rep_ & 0xfffffffc)) >> 4;
    uVar8 = 1;
    uVar4 = (s->levels_).super_type.ebo_.size;
  }
  (this->conflict_).ebo_.size = 0;
  if (this->eRoot_ < uVar4) {
    Solver::resolveToCore(s,&this->conflict_);
    uVar5 = (ulong)(this->conflict_).ebo_.size;
    if (uVar5 == 0) {
      sVar11 = 0;
      bVar13 = false;
    }
    else {
      pLVar3 = (this->conflict_).ebo_.buf;
      puVar6 = (s->assign_).assign_.ebo_.buf;
      lVar9 = 0;
      do {
        uVar4 = *(uint *)((long)&pLVar3->rep_ + lVar9);
        puVar1 = (uint *)((long)puVar6 + (ulong)(uVar4 & 0xfffffffc));
        *puVar1 = *puVar1 | (uVar4 & 2) * 2 + 4;
        lVar9 = lVar9 + 4;
      } while (uVar5 << 2 != lVar9);
      sVar11 = (this->conflict_).ebo_.size;
      uVar8 = uVar8 + sVar11;
      uVar5 = (ulong)(this->assume_).ebo_.size;
      bVar13 = sVar11 != 0;
      if (uVar5 != 0 && bVar13) {
        pLVar10 = (this->assume_).ebo_.buf;
        local_40 = &this->todo_;
        puVar6 = (s->assign_).assign_.ebo_.buf;
        lVar9 = uVar5 * 8 + -8;
        lVar12 = 0;
        local_48 = lVar9;
        local_38 = pLVar10;
        do {
          uVar4 = *(uint *)((long)&(pLVar10->lit).rep_ + lVar12);
          uVar7 = *(uint *)((long)puVar6 + (ulong)(uVar4 & 0xfffffffc));
          if (((((uVar4 & 2) * 2 + 4 & uVar7) != 0) && (uVar7 = uVar7 >> 4, this->eRoot_ < uVar7))
             && (uVar7 <= this->aTop_)) {
            if (uVar7 < local_58) {
              local_58 = uVar7;
            }
            local_50.lit.rep_ = uVar4 & 0xfffffffe ^ 2;
            local_50.id = *(uint32 *)((long)&pLVar10->id + lVar12);
            iVar2 = (this->litData_).ebo_.buf[local_50.id - 1].weight;
            bk_lib::
            pod_vector<Clasp::UncoreMinimize::LitPair,_std::allocator<Clasp::UncoreMinimize::LitPair>_>
            ::push_back(&local_40->lits_,&local_50);
            if (iVar2 < (this->todo_).minW_) {
              (this->todo_).minW_ = iVar2;
            }
            puVar6 = (s->assign_).assign_.ebo_.buf;
            puVar6[uVar4 >> 2] = puVar6[uVar4 >> 2] & 0xfffffff3;
            sVar11 = sVar11 - 1;
            pLVar10 = local_38;
            lVar9 = local_48;
          }
          bVar13 = sVar11 != 0;
        } while ((lVar9 != lVar12) && (lVar12 = lVar12 + 8, sVar11 != 0));
      }
    }
    popPath(this,s,(local_58 - 1) + (uint)(local_58 == 0));
    if (bVar13) {
      uVar8 = uVar8 - sVar11;
      uVar5 = (ulong)(this->conflict_).ebo_.size;
      if (uVar5 != 0) {
        pLVar3 = (this->conflict_).ebo_.buf;
        puVar6 = (s->assign_).assign_.ebo_.buf;
        lVar9 = 0;
        do {
          puVar1 = (uint *)((long)puVar6 +
                           (ulong)(*(uint *)((long)&pLVar3->rep_ + lVar9) & 0xfffffffc));
          *puVar1 = *puVar1 & 0xfffffff3;
          lVar9 = lVar9 + 4;
        } while (uVar5 << 2 != lVar9);
      }
    }
    (this->conflict_).ebo_.size = 0;
  }
  return uVar8;
}

Assistant:

uint32 UncoreMinimize::analyze(Solver& s) {
	uint32 cs    = 0;
	uint32 minDL = s.decisionLevel();
	if (!conflict_.empty()) {
		LitPair p(conflict_[0], conflict_[1].rep());
		assert(s.isTrue(p.lit));
		todo_.add(p, getData(p.id).weight);
		minDL = s.level(p.lit.var());
		cs = 1;
	}
	conflict_.clear();
	if (s.decisionLevel() <= eRoot_) {
		return cs;
	}
	s.resolveToCore(conflict_);
	for (LitVec::const_iterator it = conflict_.begin(), end = conflict_.end(); it != end; ++it) {
		s.markSeen(*it);
	}
	// map marked root decisions back to our assumptions
	uint32 roots = sizeVec(conflict_), dl;
	cs += roots;
	for (LitSet::iterator it = assume_.begin(), end = assume_.end(); it != end && roots; ++it) {
		Literal p = it->lit;
		if (s.seen(p) && (dl = s.level(p.var())) > eRoot_ && dl <= aTop_) {
			assert(p == s.decision(dl) && getData(it->id).assume);
			if (dl < minDL) { minDL = dl; }
			todo_.add(LitPair(~p, it->id), getData(it->id).weight);
			assert(s.isFalse(~p));
			s.clearSeen(p.var());
			--roots;
		}
	}
	popPath(s, minDL - (minDL != 0));
	if (roots) { // clear remaining levels - can only happen if someone messed with our assumptions
		cs -= roots;
		for (LitVec::const_iterator it = conflict_.begin(), end = conflict_.end(); it != end; ++it) { s.clearSeen(it->var()); }
	}
	conflict_.clear();
	return cs;
}